

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::drawBackground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
      (plVar2 = *(long **)(lVar1 + 0x498), plVar2 != (long *)0x0)) &&
     (*(int *)(*(long *)(lVar1 + 0x4e0) + 4) == 0)) {
    (**(code **)(*plVar2 + 0xe8))(plVar2,painter,rect);
    return;
  }
  uVar3 = QPainter::renderHints();
  if ((uVar3 & 1) == 0) {
    QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
    return;
  }
  QPainter::setRenderHints(painter,1,0);
  QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
  QPainter::setRenderHints(painter,1,1);
  return;
}

Assistant:

void QGraphicsView::drawBackground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsView);
    if (d->scene && d->backgroundBrush.style() == Qt::NoBrush) {
        d->scene->drawBackground(painter, rect);
        return;
    }

    const bool wasAa = painter->testRenderHint(QPainter::Antialiasing);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, false);
    painter->fillRect(rect, d->backgroundBrush);
    if (wasAa)
        painter->setRenderHints(QPainter::Antialiasing, true);
}